

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O3

vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
* getPluckerCoord<double>
            (vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *__return_storage_ptr__,
            pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
            *lPair)

{
  double dVar1;
  double dVar2;
  iterator __position;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Matrix<double,_6,_1,_0,_6,_1> l2;
  Matrix<double,_6,_1,_0,_6,_1> l1;
  undefined1 local_78 [16];
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  double local_38;
  double local_30;
  double local_28;
  double dStack_20;
  
  dVar3 = (lPair->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[0];
  dVar4 = (lPair->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1];
  local_48._0_8_ =
       (lPair->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0] - dVar3;
  local_48._8_8_ =
       (lPair->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[1] - dVar4;
  dVar1 = (lPair->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[2];
  local_38 = (lPair->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[2] - dVar1;
  dVar5 = (lPair->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[0];
  dVar6 = (lPair->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1];
  local_78._0_8_ =
       (lPair->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0] - dVar5;
  local_78._8_8_ =
       (lPair->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1] - dVar6;
  dVar2 = (lPair->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[2];
  local_68 = (lPair->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
             m_storage.m_data.array[2] - dVar2;
  auVar10._0_8_ =
       local_38 * local_38 + local_48._8_8_ * local_48._8_8_ + local_48._0_8_ * local_48._0_8_;
  if (0.0 < auVar10._0_8_) {
    auVar10._8_8_ = 0;
    auVar10 = sqrtpd(auVar10,auVar10);
    auVar11._0_8_ = auVar10._0_8_;
    local_38 = local_38 / auVar11._0_8_;
    auVar11._8_8_ = auVar11._0_8_;
    local_48 = divpd(local_48,auVar11);
  }
  dVar9 = local_68 * local_68 +
          (double)local_78._8_8_ * (double)local_78._8_8_ +
          (double)local_78._0_8_ * (double)local_78._0_8_;
  if (0.0 < dVar9) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar9;
    auVar10 = sqrtpd(auVar7,auVar7);
    auVar8._0_8_ = auVar10._0_8_;
    local_68 = local_68 / auVar8._0_8_;
    auVar8._8_8_ = auVar8._0_8_;
    local_78 = divpd(local_78,auVar8);
  }
  local_30 = local_48._8_8_ * dVar1 - dVar4 * local_38;
  local_28 = local_38 * dVar3 - dVar1 * local_48._0_8_;
  dStack_20 = local_48._0_8_ * dVar4 - dVar3 * local_48._8_8_;
  dStack_60 = local_78._8_8_ * dVar2 - dVar6 * local_68;
  local_58 = local_68 * dVar5 - dVar2 * local_78._0_8_;
  dStack_50 = local_78._0_8_ * dVar6 - dVar5 * local_78._8_8_;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Eigen::Matrix<double,6,1,0,6,1>,std::allocator<Eigen::Matrix<double,6,1,0,6,1>>>::
  _M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>const&>
            ((vector<Eigen::Matrix<double,6,1,0,6,1>,std::allocator<Eigen::Matrix<double,6,1,0,6,1>>>
              *)__return_storage_ptr__,(iterator)0x0,(Matrix<double,_6,_1,_0,_6,_1> *)local_48);
  __position._M_current =
       (__return_storage_ptr__->
       super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Eigen::Matrix<double,6,1,0,6,1>,std::allocator<Eigen::Matrix<double,6,1,0,6,1>>>::
    _M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>const&>
              ((vector<Eigen::Matrix<double,6,1,0,6,1>,std::allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                *)__return_storage_ptr__,__position,(Matrix<double,_6,_1,_0,_6,_1> *)local_78);
  }
  else {
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
    m_storage.m_data.array[4] = local_58;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
    m_storage.m_data.array[5] = dStack_50;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
    m_storage.m_data.array[2] = local_68;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
    m_storage.m_data.array[3] = dStack_60;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
    m_storage.m_data.array[0] = (double)local_78._0_8_;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
    m_storage.m_data.array[1] = (double)local_78._8_8_;
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 6,1>> getPluckerCoord(std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> lPair){

	// get line normalized direction
	Eigen::Matrix<floatPrec,3,1> dir1 = lPair.first.second.head(3) - lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lPair.second.second.head(3) - lPair.second.first.head(3);
	dir1.normalize();
	dir2.normalize();
	// get moment vectors
	Eigen::Matrix<floatPrec,3,1> p1 = lPair.first.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m1 = dir1.cross(p1);
	Eigen::Matrix<floatPrec,3,1> p2 = lPair.second.first.head(3);
	Eigen::Matrix<floatPrec,3,1> m2 = dir2.cross(p2);
	// get plucker coordinates
	Eigen::Matrix<floatPrec,6,1> l1;
	l1.head(3) = dir1; l1.tail(3) = m1;
	Eigen::Matrix<floatPrec,6,1> l2;
	l2.head(3) = dir2; l2.tail(3) = m2;

	vector<Matrix<floatPrec, 6,1>> lines;
	lines.push_back(l1); lines.push_back(l2);

	return lines;
}